

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O1

int uv_shutdown(uv_shutdown_t *req,uv_stream_t *stream,uv_shutdown_cb cb)

{
  anon_union_8_2_bf76bca6_for_active_reqs *paVar1;
  int iVar2;
  
  if ((stream->type < UV_UDP) && ((0x5080U >> (stream->type & (UV_SIGNAL|UV_UDP)) & 1) != 0)) {
    iVar2 = -0x6b;
    if ((stream->flags & 0x8303) == 0x8000) {
      if ((stream->io_watcher).fd < 0) {
        __assert_fail("uv__stream_fd(stream) >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/stream.c"
                      ,0x500,"int uv_shutdown(uv_shutdown_t *, uv_stream_t *, uv_shutdown_cb)");
      }
      req->type = UV_SHUTDOWN;
      paVar1 = &stream->loop->active_reqs;
      paVar1->count = paVar1->count + 1;
      req->handle = stream;
      req->cb = cb;
      stream->shutdown_req = req;
      stream->flags = stream->flags & 0xffff7eff | 0x100;
      uv__io_start(stream->loop,&stream->io_watcher,4);
      iVar2 = 0;
    }
    return iVar2;
  }
  __assert_fail("stream->type == UV_TCP || stream->type == UV_TTY || stream->type == UV_NAMED_PIPE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/stream.c"
                ,0x4f7,"int uv_shutdown(uv_shutdown_t *, uv_stream_t *, uv_shutdown_cb)");
}

Assistant:

int uv_shutdown(uv_shutdown_t* req, uv_stream_t* stream, uv_shutdown_cb cb) {
  assert(stream->type == UV_TCP ||
         stream->type == UV_TTY ||
         stream->type == UV_NAMED_PIPE);

  if (!(stream->flags & UV_HANDLE_WRITABLE) ||
      stream->flags & UV_HANDLE_SHUT ||
      stream->flags & UV_HANDLE_SHUTTING ||
      uv__is_closing(stream)) {
    return UV_ENOTCONN;
  }

  assert(uv__stream_fd(stream) >= 0);

  /* Initialize request */
  uv__req_init(stream->loop, req, UV_SHUTDOWN);
  req->handle = stream;
  req->cb = cb;
  stream->shutdown_req = req;
  stream->flags |= UV_HANDLE_SHUTTING;
  stream->flags &= ~UV_HANDLE_WRITABLE;

  uv__io_start(stream->loop, &stream->io_watcher, POLLOUT);
  uv__stream_osx_interrupt_select(stream);

  return 0;
}